

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_modinfo.hpp
# Opt level: O1

void __thiscall
ELFIO::modinfo_section_accessor_template<const_ELFIO::section>::process_section
          (modinfo_section_accessor_template<const_ELFIO::section> *this)

{
  char *__s;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t sVar3;
  undefined4 extraout_var_03;
  ulong uVar4;
  string info;
  long *local_98;
  long local_90;
  long local_88 [2];
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long lVar2;
  
  iVar1 = (*this->modinfo_section->_vptr_section[0x18])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 != 0) {
    iVar1 = (*this->modinfo_section->_vptr_section[0x13])();
    if (CONCAT44(extraout_var_00,iVar1) != 0) {
      local_78 = (vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&this->content;
      uVar4 = 0;
      do {
        while( true ) {
          iVar1 = (*this->modinfo_section->_vptr_section[0x13])();
          if ((CONCAT44(extraout_var_01,iVar1) <= uVar4) || (*(char *)(lVar2 + uVar4) != '\0'))
          break;
          uVar4 = uVar4 + 1;
        }
        iVar1 = (*this->modinfo_section->_vptr_section[0x13])();
        if (uVar4 < CONCAT44(extraout_var_02,iVar1)) {
          __s = (char *)(lVar2 + uVar4);
          local_98 = local_88;
          sVar3 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,__s,__s + sVar3);
          std::__cxx11::string::find((char)&local_98,0x3d);
          std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_98);
          std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_98);
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::__cxx11::string,std::__cxx11::string>(local_78,&local_70,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          uVar4 = uVar4 + local_90;
          if (local_98 != local_88) {
            operator_delete(local_98,local_88[0] + 1);
          }
        }
        iVar1 = (*this->modinfo_section->_vptr_section[0x13])();
      } while (uVar4 < CONCAT44(extraout_var_03,iVar1));
    }
  }
  return;
}

Assistant:

void process_section()
    {
        const char* pdata = modinfo_section->get_data();
        if ( pdata ) {
            ELFIO::Elf_Xword i = 0;
            while ( i < modinfo_section->get_size() ) {
                while ( i < modinfo_section->get_size() && !pdata[i] )
                    i++;
                if ( i < modinfo_section->get_size() ) {
                    std::string info = pdata + i;
                    size_t      loc  = info.find( '=' );
                    content.emplace_back( info.substr( 0, loc ),
                                          info.substr( loc + 1 ) );

                    i += info.length();
                }
            }
        }
    }